

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

bool iDynTree::calculateDH
               (Axis *zAxis_i_minus_1,Axis *xAxis_i_minus_1,Position *origin_i_minus_1,Axis *zAxis_i
               ,Direction *xAxis_n_direction_hint,Position *origin_i,Axis *xAxis_i,Axis *yAxis_i,
               DHLink *dhParams,double tol,int verbose)

{
  Position *pPVar1;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *pMVar2;
  reference pvVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Axis *in_RCX;
  StorageBaseType *in_RDX;
  double *in_RSI;
  Axis *in_RDI;
  Position *in_R9;
  double in_XMM0_Qa;
  ReturnType RVar4;
  ReturnType RVar5;
  double dVar6;
  Axis *in_stack_00000008;
  Position *in_stack_00000010;
  ReturnType *in_stack_00000018;
  double sin_theta_i;
  double cos_theta_i;
  double sin_alpha_i;
  double cos_alpha_i;
  Position x_i_z_i_minus_1_intersection_B;
  Position x_i_z_i_minus_1_intersection_A;
  Direction y_i_candidate;
  Direction x_i_candidate_2;
  Vector3d x_i_candidate_eig_2;
  Vector3d direction_axis_z_i_eig;
  int k;
  Direction xDirectionHintNotParallelToZ;
  vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> candidateDirectionHints;
  Direction x_i_candidate_1;
  double dh_direction_axis_x_n_sign;
  Vector3d x_i_candidate_eig_1;
  Direction x_i_candidate;
  Vector3d x_i_candidate_eig;
  Vector3d origin_diff;
  bool zAxes_coincident;
  bool zAxes_incident;
  Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;
  bool zAxes_not_parallel;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff858;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff860;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff868;
  undefined7 in_stack_fffffffffffff870;
  byte in_stack_fffffffffffff877;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff878;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffff880;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff888;
  double in_stack_fffffffffffff8e0;
  Axis *in_stack_fffffffffffff8e8;
  Axis *in_stack_fffffffffffff8f0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff900;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff908;
  double in_stack_fffffffffffffa28;
  Axis *in_stack_fffffffffffffa30;
  Axis *in_stack_fffffffffffffa38;
  double in_stack_fffffffffffffa58;
  Position *in_stack_fffffffffffffa60;
  Position *in_stack_fffffffffffffa68;
  Axis *in_stack_fffffffffffffa70;
  Axis *in_stack_fffffffffffffa78;
  Axis local_570;
  Position local_540 [24];
  Position local_528 [176];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_478;
  int local_3b4;
  Direction local_3b0;
  Direction local_398;
  Direction local_380;
  Direction local_368;
  vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> local_340 [4];
  ReturnType local_2e0;
  ReturnType local_258;
  Position local_1c8 [64];
  Axis local_188;
  Axis local_158;
  undefined1 local_121;
  Axis local_120;
  Axis local_f0;
  byte local_b9;
  Axis local_b8;
  Axis local_88;
  Position local_58 [31];
  undefined1 local_39;
  double local_38;
  Position *local_30;
  
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  iDynTree::Position::Position(local_58);
  iDynTree::Axis::Axis(&local_88,in_RDI);
  iDynTree::Axis::Axis(&local_b8,in_RCX);
  local_39 = closestPoints(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                           in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                           in_stack_fffffffffffffa58);
  if (!(bool)local_39) {
    pPVar1 = (Position *)iDynTree::Axis::getOrigin();
    iDynTree::Position::operator=(local_30,pPVar1);
  }
  iDynTree::Axis::setOrigin((Position *)in_stack_00000008);
  iDynTree::Axis::setOrigin(in_stack_00000010);
  iDynTree::Axis::Axis(&local_f0,in_RDI);
  iDynTree::Axis::Axis(&local_120,in_RCX);
  local_b9 = checkIfAxesAreIncident
                       (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                        in_stack_fffffffffffffa28);
  iDynTree::Axis::Axis(&local_158,in_RDI);
  iDynTree::Axis::Axis(&local_188,in_RCX);
  local_121 = checkIfAxesAreCoincident
                        (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                         in_stack_fffffffffffff8e0);
  if ((local_b9 & 1) == 0) {
    iDynTree::Position::operator-(local_1c8,local_30);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff860,
               (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff858);
    iDynTree::Axis::getDirection();
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    local_258 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                          (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    iDynTree::Axis::getDirection();
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::operator*(in_RSI,in_RDX);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff860,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                *)in_stack_fffffffffffff858);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize(in_stack_fffffffffffff868);
    Direction::Direction((Direction *)0x3a475f);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffff860,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff858);
    iDynTree::Axis::setDirection(&in_stack_00000008->direction);
  }
  else if ((bool)local_121) {
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::vector
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)0x3a48ed);
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
               (value_type *)in_stack_fffffffffffff868);
    iDynTree::Direction::Direction(&local_368,1.0,0.0,0.0);
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
               in_stack_fffffffffffff860,(value_type *)in_stack_fffffffffffff858);
    iDynTree::Direction::Direction(&local_380,0.0,1.0,0.0);
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
               in_stack_fffffffffffff860,(value_type *)in_stack_fffffffffffff858);
    iDynTree::Direction::Direction(&local_398,0.0,0.0,1.0);
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
               in_stack_fffffffffffff860,(value_type *)in_stack_fffffffffffff858);
    Direction::Direction((Direction *)0x3a49a7);
    local_3b4 = 0;
    while( true ) {
      in_stack_fffffffffffff888 =
           (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *
           )(long)local_3b4;
      pMVar2 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::size
                            (local_340);
      if (pMVar2 <= in_stack_fffffffffffff888) break;
      in_stack_fffffffffffff878 =
           (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::operator[]
                     (local_340,(long)local_3b4);
      in_stack_fffffffffffff880 =
           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            *)iDynTree::Axis::getDirection();
      in_stack_fffffffffffff877 =
           iDynTree::Direction::isParallel((Direction *)in_stack_fffffffffffff878,local_38);
      if ((in_stack_fffffffffffff877 & 1) == 0) {
        pvVar3 = std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::operator[]
                           (local_340,(long)local_3b4);
        iDynTree::Direction::operator=(&local_3b0,pvVar3);
        break;
      }
      local_3b4 = local_3b4 + 1;
    }
    this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)iDynTree::Axis::getDirection();
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff860,
               (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff858);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    in_stack_fffffffffffff860 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
         dot<Eigen::Matrix<double,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff860,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff858);
    local_478 = in_stack_fffffffffffff860;
    Eigen::operator*(in_RSI,(StorageBaseType *)in_RDX);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
              (in_stack_fffffffffffff888,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff880);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff860,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff858);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize(this);
    Direction::Direction((Direction *)0x3a4ba0);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffff860,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff858);
    iDynTree::Axis::setDirection(&in_stack_00000008->direction);
    std::operator<<((ostream *)&std::cerr,
                    "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n"
                   );
    std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::~vector
              ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
  }
  else {
    iDynTree::Axis::getDirection();
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    iDynTree::Axis::getDirection();
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
    cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize(in_stack_fffffffffffff868);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    local_2e0 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                          (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    if (local_2e0 < 0.0) {
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-(in_stack_fffffffffffff878);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff860,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffff858);
    }
    Direction::Direction((Direction *)0x3a4884);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffff860,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff858);
    iDynTree::Axis::setDirection(&in_stack_00000008->direction);
    std::operator<<((ostream *)&std::cerr,
                    "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n"
                   );
  }
  Direction::Direction((Direction *)0x3a4c18);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff860,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff858);
  iDynTree::Axis::setDirection((Direction *)in_stack_00000010);
  iDynTree::Position::Position(local_528);
  iDynTree::Position::Position(local_540);
  iDynTree::Axis::Axis(&local_570,in_RDI);
  iDynTree::Axis::Axis((Axis *)&stack0xfffffffffffffa60,in_stack_00000008);
  closestPoints(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
            (in_stack_fffffffffffff888,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff880);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar4 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
          ::dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  *in_stack_00000018 = -RVar4;
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
            (in_stack_fffffffffffff888,
             (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff880);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar4 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
          ::dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  in_stack_00000018[1] = RVar4;
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar4 = Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
          dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    ((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
          dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  dVar6 = atan2(RVar5,RVar4);
  in_stack_00000018[2] = dVar6;
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar4 = Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
          dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    ((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  iDynTree::Axis::getDirection();
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff878);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
          dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  dVar6 = atan2(RVar5,RVar4);
  in_stack_00000018[3] = dVar6;
  return true;
}

Assistant:

bool calculateDH(const iDynTree::Axis zAxis_i_minus_1,
                 const iDynTree::Axis xAxis_i_minus_1,
                 const iDynTree::Position origin_i_minus_1,
                 const iDynTree::Axis zAxis_i,
                 const iDynTree::Direction xAxis_n_direction_hint,
                       iDynTree::Position & origin_i,
                       iDynTree::Axis & xAxis_i,
                       iDynTree::Axis & yAxis_i,
                       DHLink & dhParams,
                       double tol = 1e-6,
                       int verbose = 0)
{
    // STEP 3 : Locate O_i (the origin of i-th frame)
    //          Locate the origin O_i where the common normal to z_i and z_{i-1} intersects
    //          z_i . If z_i intersects z_{i-1}, locate O_i at this intersection. If z_i and
    //          z_{i-1} are parallel, locate O_i to any convenenient location along z_i .
    bool zAxes_not_parallel;
    iDynTree::Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;

    // Compute the closest point of the axis z_i-1 and z_i
    // During this computation we get as a byproduct if the two
    // axis are parallel. If the axis are not parallel, then the
    // origin of the frame i is given by the point on z_i closest
    // to z_i_minus_1
    zAxes_not_parallel = closestPoints(zAxis_i_minus_1,
                                 zAxis_i,
                                 point_on_zAxis_i_minus_1_closest_to_zAxis_i,
                                 origin_i,
                                 tol);

    if( !zAxes_not_parallel )
    {
        //if parallel, the origin is not specified and we resort to the original one of the chain
        origin_i = zAxis_i.getOrigin();
    }

    // At this point, we can already set the origin of the the axis of i-th frame

    // \todo check that origin_i actually lies on zAxis_i

    xAxis_i.setOrigin(origin_i);
    yAxis_i.setOrigin(origin_i);

    //
    // We check if z_i and z_i-1 are incident
    //
    bool zAxes_incident = checkIfAxesAreIncident(zAxis_i_minus_1,zAxis_i);

    bool zAxes_coincident = checkIfAxesAreCoincident(zAxis_i_minus_1,zAxis_i);

    //STEP 4 : Establish the direction of x axis of the i-th frame
    //         Establish x_i along the common normal between z_{i-1} and z_i throught O_i,
    //         or in the direction normal to the z_{i-1} - z_{i} plane if z_{i-1} and z_i intersect.

    // While the book distingush just two cases for STEP 4 , we need to actually distinguish three
    // different cases :
    // * z_{i-1} and z_{i} are not incident : in this case the direction of the common normal is always defined,
    //   and in particular we compute it as the difference between the two origins, projected on the spaces
    //   orthogonal to z_i.
    // * z_{i-1} and z_{i} are incident, but not coincident: then the two axis define a plane with a unique axis
    // * z_{i-1} and z_{i} are coincident (i.e. incident and parallel): in this case there are infinite normals,
    //   and so we choose x_i using the hint provided (tipically the x_i used in the previous representation).
    if( !zAxes_incident )
    {
        // not incident

        // If the axis are not incident, the x axis is the common normal of the two axis
        Eigen::Vector3d origin_diff = toEigen(origin_i-origin_i_minus_1);

        // To actually get the normal, we remove from the origin_diff the projection on z_i_minus_1
        Eigen::Vector3d x_i_candidate_eig = origin_diff-origin_diff.dot(toEigen(zAxis_i_minus_1.getDirection()))*toEigen(zAxis_i_minus_1.getDirection());

        x_i_candidate_eig.normalize();

        iDynTree::Direction x_i_candidate;
        iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

        xAxis_i.setDirection(x_i_candidate);
    }
    else
    {
        if( !zAxes_coincident )
        {
            // incident but not coincident
            Eigen::Vector3d x_i_candidate_eig  = toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()));
            x_i_candidate_eig.normalize();

            // Check direction, use hint
            //The positive direction of the axis_x_n is arbitrary, however for dealing with limit case (link where
           // only alpha is different from zero)
           double dh_direction_axis_x_n_sign = x_i_candidate_eig.dot(toEigen(xAxis_n_direction_hint) );
           if (dh_direction_axis_x_n_sign < 0.0)
           {
               x_i_candidate_eig = -x_i_candidate_eig;
           }

           iDynTree::Direction x_i_candidate;
           iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

           xAxis_i.setDirection(x_i_candidate);

           std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n";
        }
        else
        {
            // coincident
            // if the two axis are coincident, the direction of dh_direction_axis_x_n is totally arbitrary
            // as long as it is perpendicular to zAxis. We will take then the hint provided by : direction_axis_x_n_hint
            // to get the dh_direction_axis_x_n, we will project direction_axis_x_n_hint onto the plane
            // perpendicular to axis_z_n_minus_1 == axis_z_n, and will normalize the resulting vector
            // if dh_direction_axis_x_n is parallel to the two axis, we just apply the same procedure to (1,0,0), (0,1,0)
            // and (0,0,1) (in the base frame) in this order. At least two of this three vectors will not be parallel with
            // the axis of the joint, and so they can be used as hints for the direction of
            std::vector<iDynTree::Direction> candidateDirectionHints;
            candidateDirectionHints.push_back(xAxis_n_direction_hint);
            candidateDirectionHints.push_back(iDynTree::Direction(1.0, 0.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 1.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 0.0, 1.0));

            iDynTree::Direction xDirectionHintNotParallelToZ;
            for(int k=0; k < candidateDirectionHints.size(); k++)
            {
                if (candidateDirectionHints[k].isParallel(zAxis_i.getDirection(), tol))
                {
                    continue;
                }
                else
                {
                    xDirectionHintNotParallelToZ = candidateDirectionHints[k];
                    break;
                }
            }

            Eigen::Vector3d direction_axis_z_i_eig = toEigen(zAxis_i.getDirection());
            Eigen::Vector3d x_i_candidate_eig = toEigen(xDirectionHintNotParallelToZ) -
                                                toEigen(xDirectionHintNotParallelToZ).dot(direction_axis_z_i_eig) *
                                                direction_axis_z_i_eig;

            x_i_candidate_eig.normalize();

            iDynTree::Direction x_i_candidate;
            iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

            xAxis_i.setDirection(x_i_candidate);

            std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n";
        }
    }

    // STEP 4 ADDENDUM : get y_i

    // Once the direction of axis z_n and x_n has been determined,
    //  the direction of axis y_n is simply given by a cross product to
    //  ensure a right handed coordinates system
    iDynTree::Direction y_i_candidate;
    toEigen(y_i_candidate) = toEigen(zAxis_i.getDirection()).cross(toEigen(xAxis_i.getDirection()));

    yAxis_i.setDirection(y_i_candidate);


    ////////////////////////////////////////////////////////////////////
    // STEP 5: Computation of DH parameters
    ////////////////////////////////////////////////////////////////////

    //calculation of a_i
    //distance along x_i from O_i to the intersection of the x_i and z_{i-1} axes
    iDynTree::Position x_i_z_i_minus_1_intersection_A, x_i_z_i_minus_1_intersection_B;

    closestPoints(zAxis_i_minus_1,
                  xAxis_i,
                  x_i_z_i_minus_1_intersection_A,
                  x_i_z_i_minus_1_intersection_B,
                  tol);

    //x_i and z_{i-1} should intersecate
    assert(checkIfAxesAreIncident(xAxis_i,zAxis_i_minus_1));

    dhParams.A = -(toEigen(x_i_z_i_minus_1_intersection_B)-toEigen(origin_i)).dot(toEigen(xAxis_i.getDirection()));

    //calculation of d_i
    //distance along z_{i-1} from O_{i-1} to the intersection of the x_i and z_{i-1} axes
    dhParams.D = (toEigen(x_i_z_i_minus_1_intersection_A)-toEigen(origin_i_minus_1)).dot(toEigen(zAxis_i_minus_1.getDirection()));

    //calculation of alpha_i
    //angle between z_{i-1} and z_i measured about x_i
    double cos_alpha_i = toEigen(zAxis_i_minus_1.getDirection()).dot(toEigen(zAxis_i.getDirection()));
    //assert(((direction_axis_z_n_minus_1*direction_axis_z_n)*dh_direction_axis_x_n).Norm() < tol);
    double sin_alpha_i = (toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()))).dot(toEigen(xAxis_i.getDirection()));
    //assert( fabs(cos_alpha_i*cos_alpha_i + sin_alpha_i*sin_alpha_i - 1) < tol);

    dhParams.Alpha = atan2(sin_alpha_i,cos_alpha_i);

    //calculation of theta_i
    //angle between x_{i-1} and x_i measure about z_{i-1}
    double cos_theta_i = toEigen(xAxis_i_minus_1.getDirection()).dot(toEigen(xAxis_i.getDirection()));
    double sin_theta_i = (toEigen(xAxis_i_minus_1.getDirection()).cross(toEigen(xAxis_i.getDirection()))).dot(toEigen(zAxis_i_minus_1.getDirection()));
    dhParams.Offset = atan2(sin_theta_i,cos_theta_i);

    return true;
}